

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O1

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char_const(&)[13],char_const*&,char,char_const*,char_const(&)[7],char_const*>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char (*args_2) [13],
          char **args_3,char *args_4,char **args_5,char (*args_6) [7],char **args_7)

{
  char *__s;
  size_t sVar1;
  
  __s = *arg;
  if (__s == (char *)0x0) {
    std::ios::clear((int)oss + (int)*(undefined8 *)(*(long *)oss + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,__s,sVar1);
  }
  SetWhat<char,int&,char_const(&)[13],char_const*&,char,char_const*,char_const(&)[7],char_const*>
            (this,oss,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }